

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_string.c
# Opt level: O0

void assert_print_string(char *expected,char *input)

{
  long lVar1;
  cJSON_bool cVar2;
  long in_FS_OFFSET;
  char *input_local;
  char *expected_local;
  printbuffer buffer;
  uchar printed [1024];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&expected_local,0,0x40);
  expected_local = (char *)&buffer.hooks.reallocate;
  buffer.buffer = (uchar *)0x400;
  buffer.length = 0;
  buffer.depth._0_4_ = 1;
  buffer._32_8_ = global_hooks.allocate;
  buffer.hooks.allocate = (_func_void_ptr_size_t *)global_hooks.deallocate;
  buffer.hooks.deallocate = (_func_void_void_ptr *)global_hooks.reallocate;
  cVar2 = print_string_ptr((uchar *)input,(printbuffer *)&expected_local);
  if (cVar2 == 0) {
    UnityFail("Failed to print string.",0x25);
  }
  UnityAssertEqualString
            (expected,(char *)&buffer.hooks.reallocate,"The printed string isn\'t as expected.",0x26
            );
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void assert_print_string(const char *expected, const char *input)
{
    unsigned char printed[1024];
    printbuffer buffer = { 0, 0, 0, 0, 0, 0, { 0, 0, 0 } };
    buffer.buffer = printed;
    buffer.length = sizeof(printed);
    buffer.offset = 0;
    buffer.noalloc = true;
    buffer.hooks = global_hooks;

    TEST_ASSERT_TRUE_MESSAGE(print_string_ptr((const unsigned char*)input, &buffer), "Failed to print string.");
    TEST_ASSERT_EQUAL_STRING_MESSAGE(expected, printed, "The printed string isn't as expected.");
}